

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O2

_Bool history_add(player *p,char *text,wchar_t type)

{
  bitflag flags [2];
  
  flag_wipe(flags,2);
  flag_on_dbg(flags,2,type,"flags","type");
  history_add_with_flags(p,text,flags,(artifact *)0x0);
  return true;
}

Assistant:

bool history_add(struct player *p, const char *text, int type)
{
	bitflag flags[HIST_SIZE];
	hist_wipe(flags);
	hist_on(flags, type);

	return history_add_with_flags(p, text, flags, NULL);
}